

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecXor.c
# Opt level: O2

Vec_Int_t * Acec_MapMajOuts2(Gia_Man_t *p,Vec_Int_t *vAdds,Vec_Int_t *vRanks)

{
  int iVar1;
  Vec_Int_t *p_00;
  int Entry;
  int i;
  
  p_00 = Vec_IntStartFull(p->nObjs);
  Entry = 0;
  for (i = 4; i + -4 < vAdds->nSize; i = i + 6) {
    iVar1 = Vec_IntEntry(vAdds,i);
    iVar1 = Vec_IntEntry(vRanks,iVar1);
    if (iVar1 != -1) {
      iVar1 = Vec_IntEntry(vAdds,i);
      Vec_IntWriteEntry(p_00,iVar1,Entry);
    }
    Entry = Entry + 1;
  }
  return p_00;
}

Assistant:

Vec_Int_t * Acec_MapMajOuts2( Gia_Man_t * p, Vec_Int_t * vAdds, Vec_Int_t * vRanks )
{
    Vec_Int_t * vMap = Vec_IntStartFull( Gia_ManObjNum(p) ); int i;
    for ( i = 0; 6*i < Vec_IntSize(vAdds); i++ )
        if ( Vec_IntEntry(vRanks, Vec_IntEntry(vAdds, 6*i+4)) != -1 )
            Vec_IntWriteEntry( vMap, Vec_IntEntry(vAdds, 6*i+4), i );
    return vMap;
}